

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  uint uVar8;
  ImU32 id;
  ulong uVar9;
  byte *pbVar10;
  float *pfVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  ImGuiTableColumn *pIVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ImGuiTableColumn *pIVar21;
  bool bVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ImRect host_clip_rect;
  ImRect mouse_hit_rect;
  ImRect local_68;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar6 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2342,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar26 = (table->WorkRect).Min.x;
  fVar1 = (table->WorkRect).Min.y;
  fVar2 = (pIVar6->Style).FramePadding.x;
  fVar24 = table->CellPaddingX + table->CellPaddingX + fVar2 + table->CellSpacingX1 +
           table->CellSpacingX2;
  fVar29 = (table->WorkRect).Max.x;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  uVar8 = table->ColumnsCount;
  if ((int)uVar8 < 1) {
    iVar14 = 0;
    fVar25 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
  }
  else {
    local_58 = ZEXT416((uint)(fVar2 * 4.0));
    lVar18 = 0;
    uVar20 = 0;
    iVar14 = 0;
    fVar31 = 0.0;
    fVar30 = 0.0;
    fVar25 = 0.0;
    do {
      if ((table->VisibleMaskByIndex >> (uVar20 & 0x3f) & 1) != 0) {
        pIVar17 = (table->Columns).Data;
        pIVar21 = (ImGuiTableColumn *)((long)&(pIVar17->ClipRect).Min.x + lVar18);
        if ((table->Columns).DataEnd <= pIVar21) goto LAB_002c1a3b;
        uVar8 = TableFixColumnFlags(table,*(ImGuiTableColumnFlags *)
                                           ((long)&pIVar17->FlagsIn + lVar18));
        uVar12 = (uint)(lVar18 != 0) * 0x8000 + 0x8000;
        if ((uVar8 & 0x18000) != 0) {
          uVar12 = 0;
        }
        *(uint *)((long)&pIVar17->Flags + lVar18) = uVar12 | uVar8;
        if ((table->Flags & 8) != 0) {
          TableFixColumnSortDirection(pIVar21);
        }
        fVar28 = *(float *)((long)&pIVar17->WorkMinX + lVar18);
        fVar27 = *(float *)((long)&pIVar17->ContentMaxXFrozen + lVar18);
        fVar3 = *(float *)((long)&pIVar17->ContentMaxXUnfrozen + lVar18);
        uVar8 = -(uint)(fVar3 <= fVar27);
        fVar27 = (float)(~uVar8 & (uint)fVar3 | (uint)fVar27 & uVar8) - fVar28;
        if ((((uint)table->Flags >> 0x11 & 1) == 0) &&
           ((*(byte *)((long)&pIVar17->Flags + lVar18 + 1) & 0x10) == 0)) {
          fVar28 = *(float *)((long)&pIVar17->ContentMaxXHeadersIdeal + lVar18) - fVar28;
          uVar8 = -(uint)(fVar28 <= fVar27);
          fVar27 = (float)((uint)fVar27 & uVar8 | ~uVar8 & (uint)fVar28);
        }
        fVar28 = (float)(~-(uint)(fVar2 <= fVar27) & (uint)fVar2 |
                        (uint)fVar27 & -(uint)(fVar2 <= fVar27));
        uVar8 = *(uint *)((long)&pIVar17->Flags + lVar18);
        if ((((uVar8 & 8) != 0) &&
            (fVar27 = *(float *)((long)&pIVar17->InitStretchWeightOrWidth + lVar18), 0.0 < fVar27))
           && (((table->Flags & 1U) == 0 || ((uVar8 & 0x20) == 0)))) {
          fVar28 = (float)(~-(uint)(fVar27 <= fVar28) & (uint)fVar27 |
                          -(uint)(fVar27 <= fVar28) & (uint)fVar28);
        }
        *(float *)((long)&pIVar17->WidthAuto + lVar18) = fVar28;
        if ((uVar8 & 0x18) == 0) {
          if ((uVar8 & 4) == 0) {
            __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                          ,0x2387,"void ImGui::TableUpdateLayout(ImGuiTable *)");
          }
          if ((&pIVar17->AutoFitQueue)[lVar18] != '\0') {
            fVar27 = *(float *)((long)&pIVar17->InitStretchWeightOrWidth + lVar18);
            uVar8 = -(uint)(0.0 < fVar27);
            *(uint *)((long)&pIVar17->StretchWeight + lVar18) =
                 ~uVar8 & 0x3f800000 | (uint)fVar27 & uVar8;
          }
          fVar31 = fVar31 + *(float *)((long)&pIVar17->StretchWeight + lVar18);
          if ((table->LeftMostStretchedColumnDisplayOrder == -1) ||
             ((&pIVar17->DisplayOrder)[lVar18] < table->LeftMostStretchedColumnDisplayOrder)) {
            table->LeftMostStretchedColumnDisplayOrder = (&pIVar17->DisplayOrder)[lVar18];
          }
        }
        else {
          if (((&pIVar17->AutoFitQueue)[lVar18] != 0) ||
             (((uVar8 & 0x10) != 0 && ((&pIVar17->IsClipped)[lVar18] == false)))) {
            *(float *)((long)&pIVar17->WidthRequest + lVar18) = fVar28;
          }
          if ((1 < (&pIVar17->AutoFitQueue)[lVar18]) && (table->IsInitializing == true)) {
            fVar27 = *(float *)((long)&pIVar17->WidthRequest + lVar18);
            uVar8 = -(uint)((float)local_58._0_4_ <= fVar27);
            *(uint *)((long)&pIVar17->WidthRequest + lVar18) =
                 ~uVar8 & local_58._0_4_ | (uint)fVar27 & uVar8;
          }
          iVar14 = iVar14 + 1;
          fVar30 = fVar30 + *(float *)((long)&pIVar17->WidthRequest + lVar18);
        }
        fVar25 = (float)((uint)fVar25 & -(uint)(fVar28 <= fVar25) |
                        ~-(uint)(fVar28 <= fVar25) & (uint)fVar28);
        fVar30 = fVar30 + table->CellPaddingX + table->CellPaddingX;
      }
      uVar20 = uVar20 + 1;
      uVar8 = table->ColumnsCount;
      lVar18 = lVar18 + 0x68;
    } while ((long)uVar20 < (long)(int)uVar8);
  }
  table->ColumnsVisibleFixedCount = (ImS8)iVar14;
  uVar12 = table->Flags;
  if (0 < (int)uVar8 && (uVar12 >> 0x10 & 1) != 0) {
    uVar20 = table->VisibleMaskByIndex;
    lVar18 = 0x30;
    uVar15 = 0;
    do {
      if ((uVar20 >> (uVar15 & 0x3f) & 1) != 0) {
        pIVar21 = (table->Columns).Data;
        if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)pIVar21 + lVar18 + -0x30))
        goto LAB_002c1a3b;
        if ((*(byte *)((long)pIVar21 + lVar18 + -0x18) & 0x18) == 0) {
          fVar31 = fVar31 + (1.0 - *(float *)((long)pIVar21 + lVar18 + -8));
          *(undefined4 *)((long)pIVar21 + lVar18 + -8) = 0x3f800000;
          if (iVar14 < 1) goto LAB_002c1181;
          pfVar11 = (float *)((long)&(pIVar21->ClipRect).Min.x + lVar18);
        }
        else {
          pfVar11 = &pIVar21[uVar15].WidthRequest;
          fVar30 = fVar30 + (fVar25 - *(float *)((long)&(pIVar21->ClipRect).Min.x + lVar18));
        }
        *pfVar11 = fVar25;
      }
LAB_002c1181:
      uVar15 = uVar15 + 1;
      lVar18 = lVar18 + 0x68;
    } while (uVar8 != uVar15);
  }
  bVar13 = (byte)(uVar12 >> 0x10) & 0 < iVar14;
  if ((((uVar12 >> 0x19 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar29 = fVar29 - fVar26;
  }
  else {
    fVar29 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar28 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsVisibleCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  fVar25 = 0.0;
  if (bVar13 == 0) {
    fVar25 = (fVar29 - fVar28) - fVar30;
  }
  table->ColumnsTotalWidth = fVar28;
  table->ColumnsAutoFitWidth = fVar28;
  if ((int)uVar8 < 1) {
    bVar22 = true;
  }
  else {
    uVar20 = table->VisibleMaskByDisplayOrder;
    uVar15 = 0;
    iVar14 = 0;
    fVar29 = fVar25;
    do {
      if ((uVar20 >> (uVar15 & 0x3f) & 1) != 0) {
        pcVar16 = (table->DisplayOrderToIndex).Data + uVar15;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar16) goto LAB_002c1a52;
        lVar18 = (long)*pcVar16;
        if (lVar18 < 0) goto LAB_002c1a3b;
        pIVar21 = (table->Columns).Data;
        pIVar17 = pIVar21 + lVar18;
        if ((table->Columns).DataEnd <= pIVar17) goto LAB_002c1a3b;
        if ((pIVar17->Flags & 4U) != 0) {
          if (bVar13 == 0) {
            fVar30 = (pIVar17->StretchWeight / fVar31) * fVar25;
            uVar23 = -(uint)(fVar2 <= fVar30);
            fVar30 = (float)(int)((float)(~uVar23 & (uint)fVar2 | (uint)fVar30 & uVar23) + 0.01);
            pIVar17->WidthRequest = fVar30;
            fVar29 = fVar29 - fVar30;
          }
          cVar4 = pIVar17->NextVisibleColumn;
          if ((long)cVar4 != -1) {
            if ((cVar4 < '\0') || (pIVar21 = pIVar21 + cVar4, (table->Columns).DataEnd <= pIVar21))
            goto LAB_002c1a3b;
            uVar23 = pIVar21->Flags;
            if ((uVar23 & 8) != 0) {
              pIVar17->Flags = uVar23 & 0x40000000 | pIVar17->Flags;
            }
          }
        }
        if ((pIVar17->NextVisibleColumn == -1) && (table->LeftMostStretchedColumnDisplayOrder != -1)
           ) {
          pbVar10 = (byte *)((long)&pIVar17->Flags + 3);
          *pbVar10 = *pbVar10 | 0x40;
        }
        iVar14 = iVar14 + (uint)((pIVar17->Flags & 0x20U) == 0);
        uVar23 = -(uint)(fVar2 <= pIVar17->WidthRequest);
        fVar30 = (float)(int)(float)(~uVar23 & (uint)fVar2 | (uint)pIVar17->WidthRequest & uVar23);
        pIVar17->WidthGiven = fVar30;
        fVar28 = table->CellPaddingX + table->CellPaddingX;
        table->ColumnsTotalWidth = fVar30 + fVar28 + table->ColumnsTotalWidth;
        table->ColumnsAutoFitWidth = fVar28 + pIVar17->WidthAuto + table->ColumnsAutoFitWidth;
      }
      uVar15 = uVar15 + 1;
    } while (uVar8 != uVar15);
    bVar22 = iVar14 == 0;
    fVar25 = fVar29;
  }
  if (((((uVar12 >> 0x14 & 1) == 0) && (1.0 <= fVar25)) && (1.0 <= fVar25)) &&
     ((0 < (int)uVar8 && (0.0 < fVar31)))) {
    uVar20 = table->VisibleMaskByDisplayOrder;
    uVar15 = (ulong)uVar8;
    do {
      uVar9 = uVar15 - 1;
      if ((uVar20 >> (uVar9 & 0x3f) & 1) != 0) {
        pcVar16 = (table->DisplayOrderToIndex).Data + uVar9;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar16) goto LAB_002c1a52;
        lVar18 = (long)*pcVar16;
        if ((lVar18 < 0) ||
           (pIVar21 = (table->Columns).Data + lVar18, (table->Columns).DataEnd <= pIVar21))
        goto LAB_002c1a3b;
        if ((pIVar21->Flags & 4) != 0) {
          pIVar21->WidthRequest = pIVar21->WidthRequest + 1.0;
          pIVar21->WidthGiven = pIVar21->WidthGiven + 1.0;
          fVar25 = fVar25 + -1.0;
        }
      }
    } while (((0.0 < fVar31) && (1.0 <= fVar25)) &&
            (bVar7 = 1 < (long)uVar15, uVar15 = uVar9, bVar7));
  }
  local_58[0] = bVar22;
  local_40.Min.x = (table->OuterRect).Min.x;
  local_40.Min.y = (table->OuterRect).Min.y;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar29 = (table->OuterRect).Max.y;
  fVar30 = table->LastOuterHeight + local_40.Min.y;
  uVar8 = -(uint)(fVar30 <= fVar29);
  local_40.Max.y = (float)(uVar8 & (uint)fVar29 | ~uVar8 & (uint)fVar30);
  bVar22 = ItemHoverable(&local_40,0);
  fVar29 = fVar26;
  if ('\0' < table->FreezeColumnsCount) {
    fVar29 = (table->OuterRect).Min.x;
  }
  local_68 = table->InnerClipRect;
  uVar20 = (ulong)(uint)table->ColumnsCount;
  if (0 < table->ColumnsCount) {
    fVar29 = (fVar29 + table->OuterPaddingX) - table->CellSpacingX1;
    iVar19 = 0;
    uVar15 = 0;
    iVar14 = 0;
    do {
      pbVar10 = (byte *)((table->DisplayOrderToIndex).Data + uVar15);
      if ((table->DisplayOrderToIndex).DataEnd <= pbVar10) goto LAB_002c1a52;
      bVar13 = *pbVar10;
      if (((long)(char)bVar13 < 0) ||
         (pIVar21 = (table->Columns).Data + (char)bVar13, (table->Columns).DataEnd <= pIVar21))
      goto LAB_002c1a3b;
      bVar7 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar7 = (char)bVar13 < table->FreezeColumnsCount;
      }
      pIVar21->NavLayerCurrent = bVar7;
      if (iVar14 == table->FreezeColumnsCount && '\0' < table->FreezeColumnsCount) {
        fVar29 = fVar29 + (fVar26 - (table->OuterRect).Min.x);
      }
      if ((table->VisibleMaskByDisplayOrder >> (uVar15 & 0x3f) & 1) == 0) {
        (pIVar21->ClipRect).Max.x = fVar29;
        (pIVar21->ClipRect).Min.x = fVar29;
        pIVar21->WorkMinX = fVar29;
        pIVar21->MaxX = fVar29;
        pIVar21->MinX = fVar29;
        pIVar21->WidthGiven = 0.0;
        (pIVar21->ClipRect).Min.y = fVar1;
        (pIVar21->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar21->ClipRect,&local_68);
        pIVar21->IsClipped = true;
        pIVar21->IsSkipItems = true;
        pIVar21->ItemWidth = 1.0;
      }
      else {
        if (((uint)table->Flags >> 0x19 & 1) == 0) {
          fVar30 = 3.4028235e+38;
          if (((uint)table->Flags >> 0x13 & 1) == 0) {
            fVar30 = ((((table->WorkRect).Max.x -
                       (float)(~(int)pIVar21->IndexWithinVisibleSet +
                              (int)table->ColumnsVisibleCount) * fVar24) - fVar29) -
                     table->CellSpacingX2) - (table->CellPaddingX + table->CellPaddingX);
            pfVar11 = &table->OuterPaddingX;
LAB_002c16d5:
            fVar30 = fVar30 - *pfVar11;
          }
        }
        else {
          fVar30 = 3.4028235e+38;
          if ((long)uVar15 < (long)table->FreezeColumnsRequest) {
            fVar30 = ((((table->InnerClipRect).Max.x -
                       (float)(table->FreezeColumnsRequest + iVar19) * fVar24) - fVar29) -
                     table->OuterPaddingX) - table->CellPaddingX;
            pfVar11 = &table->CellSpacingX2;
            goto LAB_002c16d5;
          }
        }
        fVar31 = pIVar21->WidthGiven;
        if (fVar30 <= pIVar21->WidthGiven) {
          fVar31 = fVar30;
        }
        fVar30 = pIVar21->WidthRequest;
        if (fVar2 <= pIVar21->WidthRequest) {
          fVar30 = fVar2;
        }
        fVar28 = (float)(~-(uint)(fVar30 <= fVar31) & (uint)fVar30 |
                        (uint)fVar31 & -(uint)(fVar30 <= fVar31));
        pIVar21->WidthGiven = fVar28;
        pIVar21->MinX = fVar29;
        fVar30 = table->CellPaddingX;
        fVar31 = table->CellSpacingX1;
        fVar25 = table->CellSpacingX2;
        fVar27 = fVar30 + fVar30 + fVar28 + fVar29 + fVar31 + fVar25;
        pIVar21->MaxX = fVar27;
        pIVar21->WorkMinX = fVar29 + fVar30 + fVar31;
        pIVar21->WorkMaxX = (fVar27 - fVar30) - fVar25;
        pIVar21->ItemWidth = (float)(int)(fVar28 * 0.65);
        (pIVar21->ClipRect).Min.x = fVar29;
        (pIVar21->ClipRect).Min.y = fVar1;
        (pIVar21->ClipRect).Max.x = fVar27;
        (pIVar21->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar21->ClipRect,&local_68);
        fVar30 = (pIVar21->ClipRect).Min.x;
        if ((fVar30 < (pIVar21->ClipRect).Max.x) || ((pIVar21->AutoFitQueue & 1) != 0)) {
          pIVar21->IsClipped = false;
        }
        else {
          pIVar21->IsClipped = (bool)(~pIVar21->CannotSkipItemsQueue & 1);
          if ((pIVar21->CannotSkipItemsQueue & 1) == 0) {
            table->VisibleUnclippedMaskByIndex =
                 table->VisibleUnclippedMaskByIndex &
                 (-2L << (bVar13 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar13 & 0x3f));
          }
        }
        bVar7 = true;
        if (pIVar21->IsVisible == true) {
          bVar7 = table->HostSkipItems;
        }
        pIVar21->IsSkipItems = bVar7;
        if (((bVar22) && (fVar31 = (pIVar6->IO).MousePos.x, fVar30 <= fVar31)) &&
           (fVar31 < (pIVar21->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar13;
        }
        fVar30 = pIVar21->WorkMinX;
        pIVar21->ContentMaxXUnfrozen = fVar30;
        pIVar21->ContentMaxXFrozen = fVar30;
        pIVar21->ContentMaxXHeadersIdeal = fVar30;
        pIVar21->ContentMaxXHeadersUsed = fVar30;
        if (table->HostSkipItems == false) {
          pIVar21->AutoFitQueue = pIVar21->AutoFitQueue >> 1;
          pIVar21->CannotSkipItemsQueue = pIVar21->CannotSkipItemsQueue >> 1;
        }
        if (iVar14 < table->FreezeColumnsCount) {
          fVar30 = pIVar21->MaxX + 1.0;
          uVar8 = -(uint)(fVar30 <= local_68.Min.x);
          local_68.Min.x = (float)(~uVar8 & (uint)fVar30 | (uint)local_68.Min.x & uVar8);
        }
        fVar29 = fVar29 + table->CellPaddingX + table->CellPaddingX +
                          pIVar21->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar14 = iVar14 + 1;
      }
      uVar15 = uVar15 + 1;
      uVar20 = (ulong)table->ColumnsCount;
      iVar19 = iVar19 + -1;
    } while ((long)uVar15 < (long)uVar20);
  }
  if ((bVar22) && (table->HoveredColumnBody == -1)) {
    fVar26 = (table->WorkRect).Min.x;
    cVar4 = table->RightMostVisibleColumn;
    if ((long)cVar4 != -1) {
      if ((cVar4 < '\0') ||
         (pIVar21 = (table->Columns).Data + cVar4, (table->Columns).DataEnd <= pIVar21)) {
LAB_002c1a3b:
        pcVar16 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
        goto LAB_002c1a67;
      }
      fVar1 = (pIVar21->ClipRect).Max.x;
      uVar8 = -(uint)(fVar1 <= fVar26);
      fVar26 = (float)((uint)fVar26 & uVar8 | ~uVar8 & (uint)fVar1);
    }
    if (fVar26 <= (pIVar6->IO).MousePos.x) {
      table->HoveredColumnBody = (ImS8)uVar20;
    }
  }
  if ((local_58[0] != '\0') && ((table->Flags & 1U) != 0)) {
    table->Flags = table->Flags & 0xfffffffe;
  }
  TableUpdateDrawChannels(table);
  if ((table->Flags & 1) != 0) {
    TableUpdateBorders(table);
  }
  table->LastFirstRowHeight = 0.0;
  table->IsLayoutLocked = true;
  table->IsUsingHeaders = false;
  if ((table->IsContextPopupOpen == true) && (table->InstanceCurrent == table->InstanceInteracted))
  {
    id = ImHashStr("##ContextMenu",0,table->ID);
    bVar22 = BeginPopupEx(id,0x141);
    if (bVar22) {
      TableDrawContextMenu(table);
      EndPopup();
    }
    else {
      table->IsContextPopupOpen = false;
    }
  }
  pIVar5 = table->InnerWindow;
  if ((table->Flags & 0x200000) == 0) {
    ImDrawList::PushClipRect(pIVar5->DrawList,(pIVar5->ClipRect).Min,(pIVar5->ClipRect).Max,false);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar5->DrawList,2);
  }
  if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
    TableSortSpecsBuild(table);
  }
  return;
LAB_002c1a52:
  pcVar16 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_002c1a67:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                ,0x217,pcVar16);
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float min_column_width = TableGetMinColumnWidth();
    const float min_column_distance = min_column_width + table->CellPaddingX * 2.0f + table->CellSpacingX1 + table->CellSpacingX2;

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    float max_width_auto = 0.0f;
    table->LeftMostStretchedColumnDisplayOrder = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float content_width_body = (float)ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
        const float content_width_headers = (float)column->ContentMaxXHeadersIdeal - column->WorkMinX;
        float width_auto = content_width_body;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            width_auto = ImMax(width_auto, content_width_headers);
        width_auto = ImMax(width_auto, min_column_width);

        // Non-resizable columns also submit their requested width
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
            if (!(table->Flags & ImGuiTableFlags_Resizable) || !(column->Flags & ImGuiTableColumnFlags_NoResize))
                width_auto = ImMax(width_auto, column->InitStretchWeightOrWidth);

        column->WidthAuto = width_auto;

        if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
        {
            // Process auto-fit for non-stretched columns
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if ((column->AutoFitQueue != 0x00) || ((column->Flags & ImGuiTableColumnFlags_WidthAutoResize) && !column->IsClipped))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f); // FIXME-TABLE: Another constant/scale?

            count_fixed += 1;
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const float default_weight = (column->InitStretchWeightOrWidth > 0.0f) ? column->InitStretchWeightOrWidth : 1.0f;
            if (column->AutoFitQueue != 0x00)
                column->StretchWeight = default_weight;
            sum_weights_stretched += column->StretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1 || table->LeftMostStretchedColumnDisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
        max_width_auto = ImMax(max_width_auto, width_auto);
        sum_width_fixed_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsVisibleFixedCount = (ImS8)count_fixed;

    // Apply "same widths"
    // - When all columns are fixed or columns are of mixed type: use the maximum auto width
    // - When all columns are stretch: use same weight
    const bool mixed_same_widths = (table->Flags & ImGuiTableFlags_SameWidths) && count_fixed > 0;
    if (table->Flags & ImGuiTableFlags_SameWidths)
    {
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            if (table->VisibleMaskByIndex & ((ImU64)1 << column_n))
            {
                ImGuiTableColumn* column = &table->Columns[column_n];
                if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
                {
                    sum_width_fixed_requests += max_width_auto - column->WidthRequest; // Update old sum
                    column->WidthRequest = max_width_auto;
                }
                else
                {
                    sum_weights_stretched += 1.0f - column->StretchWeight; // Update old sum
                    column->StretchWeight = 1.0f;
                    if (count_fixed > 0)
                        column->WidthRequest = max_width_auto;
                }
            }
    }

    // Layout
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsVisibleCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = mixed_same_widths ? 0.0f : width_avail - width_spacings - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    table->ColumnsAutoFitWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // StretchWeight gets converted into WidthRequest
            if (!mixed_same_widths) 
            {
                float weight_ratio = column->StretchWeight / sum_weights_stretched;
                column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
                width_remaining_for_stretched_columns -= column->WidthRequest;
            }

            // [Resize Rule 2] Resizing from right-side of a stretch column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven + table->CellPaddingX * 2.0f;
        table->ColumnsAutoFitWidth += column->WidthAuto + table->CellPaddingX * 2.0f;
    }

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    offset_x += table->OuterPaddingX;
    offset_x -= table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Maximum width
        float max_width = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
            {
                max_width = (table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_distance) - offset_x;
                max_width = max_width - table->OuterPaddingX - table->CellPaddingX - table->CellSpacingX2;
            }
        }
        else if ((table->Flags & ImGuiTableFlags_NoKeepColumnsVisible) == 0)
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            // FIXME-TABLE: This is solved incorrectly but also quite a difficult problem to fix as we also want ClipRect width to match.
            // See "table_width_distrib" and "table_width_keep_visible" tests
            max_width = table->WorkRect.Max.x - (table->ColumnsVisibleCount - column->IndexWithinVisibleSet - 1) * min_column_distance - offset_x;
            //max_width -= table->CellSpacingX1;
            max_width -= table->CellSpacingX2;
            max_width -= table->CellPaddingX * 2.0f;
            max_width -= table->OuterPaddingX;
        }
        column->WidthGiven = ImMin(column->WidthGiven, max_width);

        // Minimum width
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, min_column_width));

        // Lock all our positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) is detrimental to visibility in very-small column.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->MinX = offset_x;
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; // column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n); // Columns with the _WidthAutoResize sizing policy will never be updated then.

        column->IsSkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + TABLE_BORDER_SIZE);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_UNCLIPPED);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}